

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:467:34)>
::~CommandLineOptionClosure
          (CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:467:34)>
           *this)

{
  CommandLineOption::~CommandLineOption(&this->super_CommandLineOption);
  ::operator_delete(this);
  return;
}

Assistant:

CommandLineOptionClosure (std::string description, const F& f) 
        : CommandLineOption(description), f(f) {}